

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

CoinsResult * __thiscall
wallet::AvailableCoins
          (CoinsResult *__return_storage_ptr__,wallet *this,CWallet *wallet,
          CCoinControl *coinControl,optional<CFeeRate> feerate,CoinFilterParams *params)

{
  _Rb_tree_header *p_Var1;
  CWalletTx *wtx;
  CTxOut *txout;
  long lVar2;
  pointer puVar3;
  COutput *pCVar4;
  COutPoint outpoint_00;
  optional<CFeeRate> feerate_00;
  char cVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  bool can_grind_r;
  bool bVar9;
  bool from_me;
  bool bVar10;
  int depth;
  isminetype iVar11;
  int input_bytes;
  TxoutType TVar12;
  int iVar13;
  const_iterator cVar14;
  const_iterator cVar15;
  ulong uVar16;
  int64_t time;
  size_t sVar17;
  mapped_type_conflict1 *pmVar18;
  _Base_ptr p_Var19;
  ulong uVar20;
  uint uVar21;
  long *plVar22;
  OutputType type;
  long *plVar23;
  bool bVar24;
  COutput *output;
  long lVar25;
  COutput *this_00;
  long in_FS_OFFSET;
  bool bVar26;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  script_solutions;
  vector<COutPoint,_std::allocator<COutPoint>_> outpoints;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  map_of_bump_fees;
  COutPoint outpoint;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> trusted_parents;
  undefined4 local_240;
  int local_21c;
  int local_214;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1d8;
  undefined1 local_1c0 [8];
  Notifications local_1b8;
  iterator iStack_1b0;
  COutPoint *local_1a8;
  _Storage<CFeeRate,_true> local_198;
  char cStack_190;
  undefined7 uStack_18f;
  undefined1 local_188 [80];
  direct_or_indirect local_138;
  uint local_11c;
  undefined4 local_e8 [2];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  uchar local_d8 [16];
  uchar local_c8 [24];
  undefined1 auStack_b0 [32];
  _Base_ptr p_Stack_90;
  size_t local_88;
  long lStack_80;
  _Rb_tree_color local_78;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_68;
  _Base_ptr local_38;
  
  plVar22 = feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
            super__Optional_payload_base<CFeeRate>._8_8_;
  local_38 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  cStack_190 = feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
               super__Optional_payload_base<CFeeRate>._M_payload._0_1_;
  p_Var1 = &(__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->total_amount = 0;
  (__return_storage_ptr__->total_effective_amount).super__Optional_base<long,_true,_true>._M_payload
  .super__Optional_payload_base<long>._M_payload._M_value = 0;
  (__return_storage_ptr__->total_effective_amount).super__Optional_base<long,_true,_true>._M_payload
  .super__Optional_payload_base<long>._M_engaged = true;
  local_198 = (_Storage<CFeeRate,_true>)coinControl;
  bVar7 = CWallet::IsWalletFlagSet((CWallet *)this,1);
  if (bVar7) {
    if (wallet == (CWallet *)0x0) {
      bVar8 = 0;
LAB_0050b37f:
      local_21c = 9999999;
      bVar7 = false;
      local_214 = 0;
      cVar5 = '\0';
      goto LAB_0050b38f;
    }
    bVar8 = *(byte *)((long)&(wallet->mapTxSpends)._M_h._M_buckets + 3) ^ 1;
  }
  else {
    bVar8 = 1;
    if (wallet == (CWallet *)0x0) goto LAB_0050b37f;
  }
  local_214 = (int)(wallet->mapTxSpends)._M_h._M_bucket_count;
  local_21c = *(int *)((long)&(wallet->mapTxSpends)._M_h._M_bucket_count + 4);
  cVar5 = (char)(wallet->m_best_block_time).super___atomic_base<long>._M_i;
  bVar7 = true;
LAB_0050b38f:
  can_grind_r = CWallet::CanGrindR((CWallet *)this);
  local_1b8._vptr_Notifications = (_func_int **)0x0;
  iStack_1b0._M_current = (COutPoint *)0x0;
  local_1a8 = (COutPoint *)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  plVar23 = *(long **)(this + 0x268);
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if (plVar23 != (long *)0x0) {
    bVar24 = false;
    do {
      wtx = (CWalletTx *)(plVar23 + 5);
      bVar9 = CWallet::IsTxImmatureCoinBase((CWallet *)this,wtx);
      if ((!bVar9) || (*(char *)((long)plVar22 + 0x21) != '\0')) {
        depth = CWallet::GetTxDepthInMainChain((CWallet *)this,wtx);
        if ((-1 < depth) && ((depth != 0 || (bVar9 = CWalletTx::InMempool(wtx), bVar9)))) {
          bVar9 = CachedTxIsTrusted((CWallet *)this,wtx,
                                    (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                                    &local_68);
          if (depth == 0) {
            local_188._0_8_ = local_188 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"replaces_txid","");
            cVar14 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)wtx,(key_type *)local_188);
            if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
              operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
            }
            local_188._0_8_ = local_188 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_188,"replaced_by_txid","");
            cVar15 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)wtx,(key_type *)local_188);
            if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
              operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
            }
            bVar9 = (bool)((bVar9 && cVar15._M_node == (_Base_ptr)(plVar23 + 6)) &
                          ~(cVar14._M_node != (_Base_ptr)(plVar23 + 6)));
          }
          if (((cVar5 != '\0' || bVar9 != false) && (local_214 <= depth)) && (depth <= local_21c)) {
            local_188._0_4_ = 3;
            from_me = CachedTxIsFromMe((CWallet *)this,wtx,(isminefilter *)local_188);
            lVar25 = *(long *)(plVar23[0x38] + 0x18);
            if (*(long *)(plVar23[0x38] + 0x20) != lVar25) {
              uVar21 = 1;
              uVar16 = 0;
              do {
                local_78 = uVar21 - _S_black;
                auStack_b0._24_8_ = plVar23[1];
                p_Stack_90 = (_Base_ptr)plVar23[2];
                local_88 = plVar23[3];
                lStack_80 = plVar23[4];
                lVar2 = *(long *)(lVar25 + uVar16 * 0x28);
                if (((((*plVar22 <= lVar2) && (lVar2 <= plVar22[1])) &&
                     ((!bVar7 ||
                      ((bVar10 = CCoinControl::HasSelected((CCoinControl *)wallet), !bVar10 ||
                       (bVar10 = CCoinControl::IsSelected
                                           ((CCoinControl *)wallet,(COutPoint *)(auStack_b0 + 0x18))
                       , !bVar10)))))) &&
                    ((bVar10 = CWallet::IsLockedCoin
                                         ((CWallet *)this,(COutPoint *)(auStack_b0 + 0x18)), !bVar10
                     || (*(char *)((long)plVar22 + 0x22) == '\0')))) &&
                   (bVar10 = CWallet::IsSpent((CWallet *)this,(COutPoint *)(auStack_b0 + 0x18)),
                   !bVar10)) {
                  txout = (CTxOut *)(lVar25 + uVar16 * 0x28);
                  iVar11 = CWallet::IsMine((CWallet *)this,txout);
                  if ((iVar11 != ISMINE_NO) &&
                     ((bVar8 != 0 ||
                      (bVar10 = CWallet::IsSpentKey((CWallet *)this,&txout->scriptPubKey), !bVar10))
                     )) {
                    CWallet::GetSolvingProvider((CWallet *)local_1c0,(CScript *)this);
                    local_c8._16_8_ = 0;
                    auStack_b0._0_8_ = 0;
                    local_c8[0] = '\0';
                    local_c8[1] = '\0';
                    local_c8[2] = '\0';
                    local_c8[3] = '\0';
                    local_c8[4] = '\0';
                    local_c8[5] = '\0';
                    local_c8[6] = '\0';
                    local_c8[7] = '\0';
                    local_c8[8] = '\0';
                    local_c8[9] = '\0';
                    local_c8[10] = '\0';
                    local_c8[0xb] = '\0';
                    local_c8[0xc] = '\0';
                    local_c8[0xd] = '\0';
                    local_c8[0xe] = '\0';
                    local_c8[0xf] = '\0';
                    auStack_b0._8_4_ = ~_S_red;
                    outpoint_00.n = 0xffffffff;
                    outpoint_00.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
                         (uint256)(uint256)ZEXT832(0);
                    input_bytes = CalculateMaximumSignedInputSize
                                            (txout,outpoint_00,(SigningProvider *)local_1c0,
                                             can_grind_r,(CCoinControl *)wallet);
                    bVar10 = true;
                    if (((iVar11 & ISMINE_SPENDABLE) != ISMINE_NO) ||
                       (((bVar7 && (iVar11 & ISMINE_WATCH_ONLY) != ISMINE_NO && (-1 < input_bytes))
                        && (*(char *)((long)&(wallet->m_best_block_time).super___atomic_base<long>.
                                             _M_i + 2) != '\0')))) {
LAB_0050b787:
                      local_1d8.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_1d8.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_1d8.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      TVar12 = Solver(&txout->scriptPubKey,&local_1d8);
                      bVar26 = TVar12 == SCRIPTHASH;
                      if (bVar26 && -1 < input_bytes) {
                        local_188._16_8_ = 0;
                        local_188._24_8_ = 0;
                        local_188._0_8_ = (pointer)0x0;
                        local_188._8_8_ = 0;
                        puVar3 = ((local_1d8.
                                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start;
                        if ((long)((local_1d8.
                                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 != 0x14)
                        {
                          __assert_fail("vch.size() == WIDTH",
                                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/uint256.h"
                                        ,0x2a,
                                        "base_blob<160>::base_blob(Span<const unsigned char>) [BITS = 160]"
                                       );
                        }
                        local_e8[0] = *(undefined4 *)puVar3;
                        local_e8[1] = *(undefined4 *)(puVar3 + 4);
                        uStack_e0 = *(undefined4 *)(puVar3 + 8);
                        uStack_dc = *(undefined4 *)(puVar3 + 0xc);
                        local_d8._0_4_ = *(undefined4 *)(puVar3 + 0x10);
                        iVar13 = (*(*(_func_int ***)local_1c0)[2])(local_1c0,local_e8,local_188);
                        if ((char)iVar13 == '\0') {
                          local_240 = 6;
                          TVar12 = SCRIPTHASH;
                        }
                        else {
                          TVar12 = Solver((CScript *)local_188,&local_1d8);
                          local_240 = 0;
                        }
                        if (0x1c < (uint)local_188._28_4_) {
                          free((void *)local_188._0_8_);
                        }
                        bVar6 = bVar24;
                        if ((char)iVar13 != '\0') goto LAB_0050b89d;
                      }
                      else {
LAB_0050b89d:
                        if (TVar12 - PUBKEYHASH < 2) {
                          type = LEGACY;
                        }
                        else if (TVar12 - WITNESS_V0_SCRIPTHASH < 2) {
                          type = BECH32 - (bVar26 && -1 < input_bytes);
                        }
                        else {
                          type = BECH32M;
                          if (TVar12 != WITNESS_V1_TAPROOT) {
                            type = UNKNOWN;
                          }
                        }
                        time = CWalletTx::GetTxTime(wtx);
                        feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
                        super__Optional_payload_base<CFeeRate>._9_7_ = uStack_18f;
                        feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
                        super__Optional_payload_base<CFeeRate>._M_engaged = (bool)cStack_190;
                        feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
                        super__Optional_payload_base<CFeeRate>._M_payload = local_198;
                        COutput::COutput((COutput *)local_188,(COutPoint *)(auStack_b0 + 0x18),txout
                                         ,depth,input_bytes,bVar10,
                                         (bool)((byte)~(byte)((uint)input_bytes >> 0x18) >> 7),bVar9
                                         ,time,from_me,feerate_00);
                        CoinsResult::Add(__return_storage_ptr__,type,(COutput *)local_188);
                        if (0x1c < local_11c) {
                          free(local_138.indirect_contents.indirect);
                        }
                        if (iStack_1b0._M_current == local_1a8) {
                          std::vector<COutPoint,std::allocator<COutPoint>>::
                          _M_realloc_insert<COutPoint_const&>
                                    ((vector<COutPoint,std::allocator<COutPoint>> *)&local_1b8,
                                     iStack_1b0,(COutPoint *)(auStack_b0 + 0x18));
                        }
                        else {
                          (iStack_1b0._M_current)->n = local_78;
                          *(size_t *)
                           (((iStack_1b0._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data.
                            _M_elems + 0x10) = local_88;
                          *(long *)(((iStack_1b0._M_current)->hash).m_wrapped.super_base_blob<256U>.
                                    m_data._M_elems + 0x18) = lStack_80;
                          *(undefined8 *)
                           ((iStack_1b0._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data.
                           _M_elems = auStack_b0._24_8_;
                          *(_Base_ptr *)
                           (((iStack_1b0._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data.
                            _M_elems + 8) = p_Stack_90;
                          iStack_1b0._M_current = iStack_1b0._M_current + 1;
                        }
                        local_240 = 1;
                        bVar6 = true;
                        if (((plVar22[2] == 2100000000000000) ||
                            (__return_storage_ptr__->total_amount < plVar22[2])) &&
                           ((uVar16 = plVar22[3], uVar16 == 0 ||
                            (sVar17 = CoinsResult::Size(__return_storage_ptr__), sVar17 < uVar16))))
                        {
                          local_240 = 0;
                          bVar6 = bVar24;
                        }
                      }
                      bVar24 = bVar6;
                      std::
                      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::~vector(&local_1d8);
                    }
                    else {
                      local_240 = 6;
                      if ((char)plVar22[4] == '\0') {
                        bVar10 = false;
                        goto LAB_0050b787;
                      }
                    }
                    if (local_1c0 != (undefined1  [8])0x0) {
                      (*(*(_func_int ***)local_1c0)[1])();
                    }
                    switch(local_240) {
                    case 0:
                    case 6:
                      break;
                    default:
                      std::
                      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                      ::~_Rb_tree(&local_68);
                      if (local_1b8._vptr_Notifications != (_func_int **)0x0) {
                        operator_delete(local_1b8._vptr_Notifications,
                                        (long)local_1a8 - (long)local_1b8._vptr_Notifications);
                      }
                      if (!bVar24) {
                        _GLOBAL__N_1::std::
                        _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                        ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                                     *)__return_storage_ptr__);
                      }
                      goto LAB_0050bb78;
                    case 2:
                      goto switchD_0050ba62_caseD_2;
                    case 3:
                      goto switchD_0050ba62_caseD_3;
                    }
                  }
                }
                uVar16 = (ulong)uVar21;
                lVar25 = *(long *)(plVar23[0x38] + 0x18);
                uVar20 = (*(long *)(plVar23[0x38] + 0x20) - lVar25 >> 3) * -0x3333333333333333;
                uVar21 = uVar21 + 1;
              } while (uVar16 <= uVar20 && uVar20 - uVar16 != 0);
            }
          }
        }
      }
switchD_0050ba62_caseD_3:
      plVar23 = (long *)*plVar23;
    } while (plVar23 != (long *)0x0);
  }
switchD_0050ba62_caseD_2:
  if (cStack_190 == '\x01') {
    plVar22 = *(long **)(this + 0xb8);
    if (plVar22 == (long *)0x0) {
      __assert_fail("m_chain",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                    ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
    }
    (**(code **)(*plVar22 + 0xb8))(local_188,plVar22,&local_1b8,&local_198);
    p_Var19 = (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var19 != p_Var1) {
      do {
        pCVar4 = (COutput *)p_Var19[1]._M_left;
        for (this_00 = (COutput *)p_Var19[1]._M_parent; this_00 != pCVar4; this_00 = this_00 + 1) {
          pmVar18 = std::
                    map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    ::at((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                          *)local_188,&this_00->outpoint);
          COutput::ApplyBumpFee(this_00,*pmVar18);
        }
        p_Var19 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var19);
      } while ((_Rb_tree_header *)p_Var19 != p_Var1);
    }
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
    ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 *)local_188);
  }
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&local_68);
  if (local_1b8._vptr_Notifications != (_func_int **)0x0) {
    operator_delete(local_1b8._vptr_Notifications,
                    (long)local_1a8 - (long)local_1b8._vptr_Notifications);
  }
LAB_0050bb78:
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CoinsResult AvailableCoins(const CWallet& wallet,
                           const CCoinControl* coinControl,
                           std::optional<CFeeRate> feerate,
                           const CoinFilterParams& params)
{
    AssertLockHeld(wallet.cs_wallet);

    CoinsResult result;
    // Either the WALLET_FLAG_AVOID_REUSE flag is not set (in which case we always allow), or we default to avoiding, and only in the case where
    // a coin control object is provided, and has the avoid address reuse flag set to false, do we allow already used addresses
    bool allow_used_addresses = !wallet.IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE) || (coinControl && !coinControl->m_avoid_address_reuse);
    const int min_depth = {coinControl ? coinControl->m_min_depth : DEFAULT_MIN_DEPTH};
    const int max_depth = {coinControl ? coinControl->m_max_depth : DEFAULT_MAX_DEPTH};
    const bool only_safe = {coinControl ? !coinControl->m_include_unsafe_inputs : true};
    const bool can_grind_r = wallet.CanGrindR();
    std::vector<COutPoint> outpoints;

    std::set<uint256> trusted_parents;
    for (const auto& entry : wallet.mapWallet)
    {
        const uint256& txid = entry.first;
        const CWalletTx& wtx = entry.second;

        if (wallet.IsTxImmatureCoinBase(wtx) && !params.include_immature_coinbase)
            continue;

        int nDepth = wallet.GetTxDepthInMainChain(wtx);
        if (nDepth < 0)
            continue;

        // We should not consider coins which aren't at least in our mempool
        // It's possible for these to be conflicted via ancestors which we may never be able to detect
        if (nDepth == 0 && !wtx.InMempool())
            continue;

        bool safeTx = CachedTxIsTrusted(wallet, wtx, trusted_parents);

        // We should not consider coins from transactions that are replacing
        // other transactions.
        //
        // Example: There is a transaction A which is replaced by bumpfee
        // transaction B. In this case, we want to prevent creation of
        // a transaction B' which spends an output of B.
        //
        // Reason: If transaction A were initially confirmed, transactions B
        // and B' would no longer be valid, so the user would have to create
        // a new transaction C to replace B'. However, in the case of a
        // one-block reorg, transactions B' and C might BOTH be accepted,
        // when the user only wanted one of them. Specifically, there could
        // be a 1-block reorg away from the chain where transactions A and C
        // were accepted to another chain where B, B', and C were all
        // accepted.
        if (nDepth == 0 && wtx.mapValue.count("replaces_txid")) {
            safeTx = false;
        }

        // Similarly, we should not consider coins from transactions that
        // have been replaced. In the example above, we would want to prevent
        // creation of a transaction A' spending an output of A, because if
        // transaction B were initially confirmed, conflicting with A and
        // A', we wouldn't want to the user to create a transaction D
        // intending to replace A', but potentially resulting in a scenario
        // where A, A', and D could all be accepted (instead of just B and
        // D, or just A and A' like the user would want).
        if (nDepth == 0 && wtx.mapValue.count("replaced_by_txid")) {
            safeTx = false;
        }

        if (only_safe && !safeTx) {
            continue;
        }

        if (nDepth < min_depth || nDepth > max_depth) {
            continue;
        }

        bool tx_from_me = CachedTxIsFromMe(wallet, wtx, ISMINE_ALL);

        for (unsigned int i = 0; i < wtx.tx->vout.size(); i++) {
            const CTxOut& output = wtx.tx->vout[i];
            const COutPoint outpoint(Txid::FromUint256(txid), i);

            if (output.nValue < params.min_amount || output.nValue > params.max_amount)
                continue;

            // Skip manually selected coins (the caller can fetch them directly)
            if (coinControl && coinControl->HasSelected() && coinControl->IsSelected(outpoint))
                continue;

            if (wallet.IsLockedCoin(outpoint) && params.skip_locked)
                continue;

            if (wallet.IsSpent(outpoint))
                continue;

            isminetype mine = wallet.IsMine(output);

            if (mine == ISMINE_NO) {
                continue;
            }

            if (!allow_used_addresses && wallet.IsSpentKey(output.scriptPubKey)) {
                continue;
            }

            std::unique_ptr<SigningProvider> provider = wallet.GetSolvingProvider(output.scriptPubKey);

            int input_bytes = CalculateMaximumSignedInputSize(output, COutPoint(), provider.get(), can_grind_r, coinControl);
            // Because CalculateMaximumSignedInputSize infers a solvable descriptor to get the satisfaction size,
            // it is safe to assume that this input is solvable if input_bytes is greater than -1.
            bool solvable = input_bytes > -1;
            bool spendable = ((mine & ISMINE_SPENDABLE) != ISMINE_NO) || (((mine & ISMINE_WATCH_ONLY) != ISMINE_NO) && (coinControl && coinControl->fAllowWatchOnly && solvable));

            // Filter by spendable outputs only
            if (!spendable && params.only_spendable) continue;

            // Obtain script type
            std::vector<std::vector<uint8_t>> script_solutions;
            TxoutType type = Solver(output.scriptPubKey, script_solutions);

            // If the output is P2SH and solvable, we want to know if it is
            // a P2SH (legacy) or one of P2SH-P2WPKH, P2SH-P2WSH (P2SH-Segwit). We can determine
            // this from the redeemScript. If the output is not solvable, it will be classified
            // as a P2SH (legacy), since we have no way of knowing otherwise without the redeemScript
            bool is_from_p2sh{false};
            if (type == TxoutType::SCRIPTHASH && solvable) {
                CScript script;
                if (!provider->GetCScript(CScriptID(uint160(script_solutions[0])), script)) continue;
                type = Solver(script, script_solutions);
                is_from_p2sh = true;
            }

            result.Add(GetOutputType(type, is_from_p2sh),
                       COutput(outpoint, output, nDepth, input_bytes, spendable, solvable, safeTx, wtx.GetTxTime(), tx_from_me, feerate));

            outpoints.push_back(outpoint);

            // Checks the sum amount of all UTXO's.
            if (params.min_sum_amount != MAX_MONEY) {
                if (result.GetTotalAmount() >= params.min_sum_amount) {
                    return result;
                }
            }

            // Checks the maximum number of UTXO's.
            if (params.max_count > 0 && result.Size() >= params.max_count) {
                return result;
            }
        }
    }

    if (feerate.has_value()) {
        std::map<COutPoint, CAmount> map_of_bump_fees = wallet.chain().calculateIndividualBumpFees(outpoints, feerate.value());

        for (auto& [_, outputs] : result.coins) {
            for (auto& output : outputs) {
                output.ApplyBumpFee(map_of_bump_fees.at(output.outpoint));
            }
        }
    }

    return result;
}